

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
          (SmallVectorTemplateBase<llvm::StringRef,_true> *this,StringRef *Elt)

{
  undefined8 *puVar1;
  size_t sVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).super_SmallVectorBase.Capacity
      <= uVar3) {
    grow(this,0);
    uVar3 = (this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).super_SmallVectorBase.
            Size;
  }
  sVar2 = Elt->Length;
  puVar1 = (undefined8 *)
           ((long)(this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).
                  super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x10);
  *puVar1 = Elt->Data;
  puVar1[1] = sVar2;
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).
                    super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }